

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O0

ostream * operator<<(ostream *out,bdProxyTuple *t)

{
  bdProxyTuple *t_local;
  ostream *out_local;
  
  std::operator<<(out,"[---");
  bdStdPrintNodeId(out,&t->srcId);
  std::operator<<(out,"---");
  bdStdPrintNodeId(out,&t->proxyId);
  std::operator<<(out,"---");
  bdStdPrintNodeId(out,&t->destId);
  std::operator<<(out,"---]");
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const bdProxyTuple &t) {
	out << "[---";
	bdStdPrintNodeId(out, &(t.srcId));
	out << "---";
	bdStdPrintNodeId(out, &(t.proxyId));
	out << "---";
	bdStdPrintNodeId(out, &(t.destId));
	out << "---]";

	return out;
}